

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_headers(Stream *strm,Headers *headers)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  FILE *__stream;
  size_t *extraout_RDX;
  size_t *__n;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  char **in_RDI;
  char *end;
  int line_terminator_len;
  stream_line_reader line_reader;
  char buf [2048];
  int bufsiz;
  stream_line_reader *in_stack_fffffffffffff738;
  char *in_stack_fffffffffffff740;
  Stream *in_stack_fffffffffffff748;
  stream_line_reader *in_stack_fffffffffffff750;
  stream_line_reader local_868;
  char *in_stack_fffffffffffff7f8;
  char *in_stack_fffffffffffff800;
  anon_class_8_1_b2c1a266 in_stack_fffffffffffff808;
  bool local_1;
  
  __stream = (FILE *)0x800;
  stream_line_reader::stream_line_reader
            (in_stack_fffffffffffff750,in_stack_fffffffffffff748,in_stack_fffffffffffff740,
             (size_t)in_stack_fffffffffffff738);
  __n = extraout_RDX;
  do {
    do {
      uVar2 = stream_line_reader::getline(&local_868,in_RDI,__n,__stream);
      if ((uVar2 & 1) == 0) {
        local_1 = false;
LAB_001279e6:
        stream_line_reader::~stream_line_reader((stream_line_reader *)0x1279f0);
        return local_1;
      }
      bVar1 = stream_line_reader::end_with_crlf(in_stack_fffffffffffff750);
      __n = extraout_RDX_00;
    } while (!bVar1);
    sVar3 = stream_line_reader::size(in_stack_fffffffffffff738);
    if (sVar3 == 2) {
      local_1 = true;
      goto LAB_001279e6;
    }
    sVar3 = stream_line_reader::size(in_stack_fffffffffffff738);
    if (0x2000 < sVar3) {
      local_1 = false;
      goto LAB_001279e6;
    }
    pcVar4 = stream_line_reader::ptr(in_stack_fffffffffffff738);
    in_stack_fffffffffffff750 =
         (stream_line_reader *)stream_line_reader::size(in_stack_fffffffffffff738);
    __stream = (FILE *)0x2;
    in_RDI = (char **)(pcVar4 + (long)in_stack_fffffffffffff750 + -2);
    stream_line_reader::ptr(in_stack_fffffffffffff738);
    parse_header<httplib::detail::read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
              (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,in_stack_fffffffffffff808);
    __n = extraout_RDX_01;
  } while( true );
}

Assistant:

inline bool read_headers(Stream& strm, Headers& headers) {
            const auto bufsiz = 2048;
            char buf[bufsiz];
            stream_line_reader line_reader(strm, buf, bufsiz);

            for (;;) {
                if (!line_reader.getline()) { return false; }

                // Check if the line ends with CRLF.
                auto line_terminator_len = 2;
                if (line_reader.end_with_crlf()) {
                    // Blank line indicates end of headers.
                    if (line_reader.size() == 2) { break; }
                #ifdef CPPHTTPLIB_ALLOW_LF_AS_LINE_TERMINATOR
                } else {
                    // Blank line indicates end of headers.
                    if (line_reader.size() == 1) { break; }
                    line_terminator_len = 1;
                }
            #else
            } else {
                    continue; // Skip invalid line.
                }